

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77.cpp
# Opt level: O2

void __thiscall Lz77Decoder::run(Lz77Decoder *this)

{
  string *psVar1;
  char cVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  string local_530;
  Lz77Decoder *local_510;
  string local_508 [32];
  string local_4e8 [32];
  stringstream offset_s;
  ulong local_4c0;
  ostream local_4b8 [376];
  stringstream output;
  ostream local_330 [376];
  stringstream amount_s;
  ostream local_1a8 [376];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"LZ77 decryption...");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringstream::stringstream((stringstream *)&output);
  psVar1 = &(this->super_Cryptor).in_message_;
  uVar5 = 0;
  local_510 = this;
  while( true ) {
    std::__cxx11::string::string((string *)&offset_s,(string *)psVar1);
    uVar4 = (uint)uVar5;
    std::__cxx11::string::~string((string *)&offset_s);
    if (local_4c0 <= uVar5) break;
    std::__cxx11::string::string((string *)&offset_s,(string *)psVar1);
    cVar2 = *(char *)(_offset_s + uVar5);
    std::__cxx11::string::~string((string *)&offset_s);
    if (cVar2 == '[') {
      std::__cxx11::stringstream::stringstream((stringstream *)&offset_s);
      std::__cxx11::stringstream::stringstream((stringstream *)&amount_s);
      uVar4 = uVar4 + 2;
      while( true ) {
        std::__cxx11::string::string((string *)&local_530,(string *)psVar1);
        cVar2 = local_530._M_dataplus._M_p[uVar4 - 1];
        std::__cxx11::string::~string((string *)&local_530);
        if (cVar2 == ',') break;
        std::__cxx11::string::string((string *)&local_530,(string *)psVar1);
        std::operator<<(local_4b8,local_530._M_dataplus._M_p[uVar4 - 1]);
        std::ostream::flush();
        std::__cxx11::string::~string((string *)&local_530);
        uVar4 = uVar4 + 1;
      }
      while( true ) {
        std::__cxx11::string::string((string *)&local_530,(string *)psVar1);
        cVar2 = local_530._M_dataplus._M_p[uVar4];
        std::__cxx11::string::~string((string *)&local_530);
        if (cVar2 == ']') break;
        std::__cxx11::string::string((string *)&local_530,(string *)psVar1);
        std::operator<<(local_1a8,local_530._M_dataplus._M_p[uVar4]);
        std::ostream::flush();
        std::__cxx11::string::~string((string *)&local_530);
        uVar4 = uVar4 + 1;
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stoi(&local_530,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stoi(&local_530,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::substr((ulong)&local_530,(ulong)local_4e8);
      std::operator<<(local_330,(string *)&local_530);
      std::ostream::flush();
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string(local_4e8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&amount_s);
      std::__cxx11::stringstream::~stringstream((stringstream *)&offset_s);
    }
    else {
      std::__cxx11::string::string((string *)&offset_s,(string *)psVar1);
      std::operator<<(local_330,*(char *)(_offset_s + uVar5));
      std::ostream::flush();
      std::__cxx11::string::~string((string *)&offset_s);
    }
    uVar5 = (ulong)(uVar4 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&(local_510->super_Cryptor).out_message_,local_508);
  std::__cxx11::string::~string(local_508);
  poVar3 = std::operator<<((ostream *)&std::cout,"decryption done.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringstream::~stringstream((stringstream *)&output);
  return;
}

Assistant:

void Lz77Decoder::run() {
  cout << "LZ77 decryption..." << endl;

  stringstream output;

  for (unsigned int i = 0; i < get_in_message().length(); i++) {
    if (get_in_message()[i] == LEFT_BREAK) {
      i++;

      stringstream offset_s;
      stringstream amount_s;
      while (get_in_message()[i] != SEPARATOR) {
        offset_s << get_in_message()[i] << flush;
        i++;
      }
      i++;
      while (get_in_message()[i] != RIGHT_BREAK) {
        amount_s << get_in_message()[i] << flush;
        i++;
      }

      auto offset = stoi(offset_s.str());
      auto amount = stoi(amount_s.str());
      auto len = static_cast<int>(output.str().length());

      output << output.str().substr(static_cast<unsigned long>(len - offset),
        static_cast<unsigned long>(amount)) << flush;
    }
    else {
      output << get_in_message()[i] << flush;
    }
  }

  set_out_message(output.str());

  cout << "decryption done." << endl;
}